

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintTupleTo<std::tuple<unsigned_char,void(*)(short_const*,int*,int,txfm_param*)>,2ul>
               (undefined8 param_1,ostream *param_2)

{
  ostream *in_stack_ffffffffffffffd8;
  _func_void_short_ptr_int_ptr_int_txfm_param_ptr **in_stack_ffffffffffffffe0;
  
  PrintTupleTo<std::tuple<unsigned_char,void(*)(short_const*,int*,int,txfm_param*)>,1ul>
            (param_1,param_2);
  std::operator<<(param_2,", ");
  std::get<1ul,unsigned_char,void(*)(short_const*,int*,int,txfm_param*)>
            ((tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)> *)0x9d7558);
  UniversalPrinter<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>::Print
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}